

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
Address_SegwitAddressFromStringTest_Test::TestBody(Address_SegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Address address;
  undefined3 uStack_187;
  undefined1 local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128 [7];
  Script local_80 [2];
  
  cfd::core::Address::Address(&address);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
                 (allocator *)&gtest_ar_4);
      cfd::core::Address::Address((Address *)&gtest_ar_1,(string *)&gtest_ar);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1aa,
               "Expected: (address = Address(\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             "address.GetAddress().c_str()","bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ac,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  gtest_ar_4.success_ = (bool)address;
  gtest_ar_4._1_3_ = uStack_187;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar_1,"NetType::kMainnet","address.GetNetType()",(NetType *)&gtest_ar
             ,(NetType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&gtest_ar,(AddressType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  gtest_ar_4.success_ = (bool)local_180;
  bVar1 = gtest_ar_4.success_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar_1,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&gtest_ar,(WitnessVersion *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1af,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,&local_158);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,&local_140);
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_4.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::Script::Script((Script *)&gtest_ar_1,local_80);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"\"\"","address.GetScript().GetHex().c_str()","",
             (char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_4.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
                 (allocator *)&gtest_ar_4);
      cfd::core::Address::Address((Address *)&gtest_ar_1,(string *)&gtest_ar);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b5,
               "Expected: (address = Address(\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\"",
             "address.GetAddress().c_str()",
             "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  gtest_ar_4.success_ = (bool)address;
  gtest_ar_4._1_3_ = uStack_187;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar_1,"NetType::kTestnet","address.GetNetType()",(NetType *)&gtest_ar
             ,(NetType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"AddressType::kP2wshAddress","address.GetAddressType()",
             (AddressType *)&gtest_ar,(AddressType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar_1,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&gtest_ar,(WitnessVersion *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ba,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
                 (allocator *)&gtest_ar_4);
      cfd::core::Address::Address((Address *)&gtest_ar_1,(string *)&gtest_ar);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1bc,
               "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\"",
             "address.GetAddress().c_str()","bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1be,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  gtest_ar_4.success_ = (bool)address;
  gtest_ar_4._1_3_ = uStack_187;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar_1,"NetType::kRegtest","address.GetNetType()",(NetType *)&gtest_ar
             ,(NetType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1bf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&gtest_ar,(AddressType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar_1,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&gtest_ar,(WitnessVersion *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
                 (allocator *)&gtest_ar_4);
      cfd::core::Address::Address((Address *)&gtest_ar_1,(string *)&gtest_ar);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c3,
               "Expected: (address = Address(\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\"",
             "address.GetAddress().c_str()",
             "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  gtest_ar_4.success_ = (bool)address;
  gtest_ar_4._1_3_ = uStack_187;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar_1,"NetType::kRegtest","address.GetNetType()",(NetType *)&gtest_ar
             ,(NetType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"AddressType::kTaprootAddress","address.GetAddressType()",
             (AddressType *)&gtest_ar,(AddressType *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  gtest_ar_4.success_ = bVar1;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar_1,"WitnessVersion::kVersion1","address.GetWitnessVersion()",
             (WitnessVersion *)&gtest_ar,(WitnessVersion *)&gtest_ar_4);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,&local_158);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetHash().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ca,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,local_128);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetSchnorrPubkey().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1cc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&gtest_ar,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6",
               (allocator *)&gtest_ar_4);
    cfd::core::Address::Address((Address *)&gtest_ar_1,(string *)&gtest_ar);
    cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
    cfd::core::Address::~Address((Address *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar_1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
             ,0x1d0,
             "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
  cfd::core::Address::~Address(&address);
  return;
}

Assistant:

TEST(Address, SegwitAddressFromStringTest) {
  Address address;
  EXPECT_NO_THROW((address = Address("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q")));
  EXPECT_STREQ("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt")));
  EXPECT_STREQ("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6")));
  EXPECT_STREQ("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq")));
  EXPECT_STREQ("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetHash().GetHex().c_str());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetSchnorrPubkey().GetHex().c_str());

  // Illegal data
  EXPECT_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6")),
               CfdException);
}